

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::
Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::do_oper
          (Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
           *this,Dispatch_State *t_ss,Opers t_oper,string *t_oper_string,Boxed_Value *t_lhs,
          Boxed_Value *t_rhs)

{
  undefined4 in_register_00000014;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Value BVar2;
  string_view t_name;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *in_stack_00000008;
  Function_Push_Pop fpp;
  array<chaiscript::Boxed_Value,_2UL> params;
  Function_Push_Pop local_78;
  undefined1 local_70 [32];
  Conversion_Saves local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if ((((Opers)t_oper_string == invalid) ||
      (((((t_rhs->m_data).
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_type_info).m_flags & 0x10) == 0)) ||
     (((in_stack_00000008->_M_ptr->m_type_info).m_flags & 0x10) == 0)) {
    detail::Function_Push_Pop::Function_Push_Pop
              (&local_78,(Dispatch_State *)CONCAT44(in_register_00000014,t_oper));
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)local_70,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_rhs);
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)((array<chaiscript::Boxed_Value,_2UL> *)local_70)->_M_elems + 0x10),
               in_stack_00000008);
    local_50._0_8_ = (Type_Conversions *)local_70;
    local_50.saves.
    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_50;
    detail::Function_Push_Pop::save_params(&local_78,(Function_Params *)&local_50);
    t_name._M_str =
         (char *)(t_lhs->m_data).
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    t_name._M_len =
         (size_t)(((Dispatch_State *)CONCAT44(in_register_00000014,t_oper))->m_engine)._M_data;
    local_50._0_8_ = (Type_Conversions *)local_70;
    local_50.saves.
    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_50;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)this,t_name,
               (atomic_uint_fast32_t *)
               (t_lhs->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&local_50);
    std::array<chaiscript::Boxed_Value,_2UL>::~array
              ((array<chaiscript::Boxed_Value,_2UL> *)local_70);
    detail::Function_Push_Pop::~Function_Push_Pop(&local_78);
    _Var1._M_pi = extraout_RDX;
  }
  else {
    BVar2 = Boxed_Number::oper((Boxed_Number *)this,(Opers)t_oper_string,t_rhs,
                               (Boxed_Value *)in_stack_00000008);
    _Var1._M_pi = BVar2.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_oper(const chaiscript::detail::Dispatch_State &t_ss,
                          Operators::Opers t_oper,
                          const std::string &t_oper_string,
                          const Boxed_Value &t_lhs,
                          const Boxed_Value &t_rhs) const {
        try {
          if (t_oper != Operators::Opers::invalid && t_lhs.get_type_info().is_arithmetic() && t_rhs.get_type_info().is_arithmetic()) {
            // If it's an arithmetic operation we want to short circuit dispatch
            try {
              return Boxed_Number::do_oper(t_oper, t_lhs, t_rhs);
            } catch (const chaiscript::exception::arithmetic_error &) {
              throw;
            } catch (...) {
              throw exception::eval_error("Error with numeric operator calling: " + t_oper_string);
            }
          } else {
            chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);
            std::array<Boxed_Value, 2> params{t_lhs, t_rhs};
            fpp.save_params(Function_Params(params));
            return t_ss->call_function(t_oper_string, m_loc, Function_Params(params), t_ss.conversions());
          }
        } catch (const exception::dispatch_error &e) {
          throw exception::eval_error("Can not find appropriate '" + t_oper_string + "' operator.", e.parameters, e.functions, false, *t_ss);
        }
      }